

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall leveldb::CorruptionTest::CorruptionTest(CorruptionTest *this)

{
  Cache *pCVar1;
  allocator local_29;
  leveldb local_28 [8];
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CorruptionTest_00174058;
  test::ErrorEnv::ErrorEnv(&this->env_);
  Options::Options(&this->options_);
  this->db_ = (DB *)0x0;
  std::__cxx11::string::string((string *)&this->dbname_,"/memenv/corruption_test",&local_29);
  pCVar1 = NewLRUCache(100);
  this->tiny_cache_ = pCVar1;
  (this->options_).env = (Env *)&this->env_;
  (this->options_).block_cache = pCVar1;
  DestroyDB(local_28,&this->dbname_,&this->options_);
  Status::~Status((Status *)local_28);
  (this->options_).create_if_missing = true;
  Reopen(this);
  (this->options_).create_if_missing = false;
  return;
}

Assistant:

CorruptionTest()
      : db_(nullptr),
        dbname_("/memenv/corruption_test"),
        tiny_cache_(NewLRUCache(100)) {
    options_.env = &env_;
    options_.block_cache = tiny_cache_;
    DestroyDB(dbname_, options_);

    options_.create_if_missing = true;
    Reopen();
    options_.create_if_missing = false;
  }